

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O2

char * IoTHubAccount_GetEventhubConsumerGroup(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  char *pcVar1;
  
  pcVar1 = getenv("IOTHUB_EVENTHUB_CONSUMER_GROUP");
  if (pcVar1 != (char *)0x0) {
    pcVar1 = strcpy(IoTHubAccount_GetEventhubConsumerGroup::consumerGroup,pcVar1);
    return pcVar1;
  }
  builtin_strncpy(IoTHubAccount_GetEventhubConsumerGroup::consumerGroup,"$Default",9);
  return IoTHubAccount_GetEventhubConsumerGroup::consumerGroup;
}

Assistant:

const char* IoTHubAccount_GetEventhubConsumerGroup(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    (void)acctHandle;
#ifdef MBED_BUILD_TIMESTAMP
    return getMbedParameter("IOTHUB_EVENTHUB_CONSUMER_GROUP");
#else
    static char consumerGroup[64];
    char *envVarValue = getenv("IOTHUB_EVENTHUB_CONSUMER_GROUP");
    if (envVarValue != NULL)
    {
        strcpy(consumerGroup, envVarValue);
    }
    else
    {
        strcpy(consumerGroup, DEFAULT_CONSUMER_GROUP);
    }
    return consumerGroup;
#endif
}